

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::StringFieldGenerator::GenerateAccessorDeclarations
          (StringFieldGenerator *this,Printer *printer)

{
  FieldOptions_CType FVar1;
  FieldOptions *pFVar2;
  Printer *printer_local;
  StringFieldGenerator *this_local;
  
  pFVar2 = FieldDescriptor::options(this->descriptor_);
  FVar1 = FieldOptions::ctype(pFVar2);
  if (FVar1 != FieldOptions_CType_STRING) {
    io::Printer::Outdent(printer);
    io::Printer::Print(printer," private:\n  // Hidden due to unknown ctype option.\n");
    io::Printer::Indent(printer);
  }
  io::Printer::Print(printer,&this->variables_,
                     "inline const ::std::string& $name$() const$deprecation$;\ninline void set_$name$(const ::std::string& value)$deprecation$;\ninline void set_$name$(const char* value)$deprecation$;\ninline void set_$name$(const $pointer_type$* value, size_t size)$deprecation$;\ninline ::std::string* mutable_$name$()$deprecation$;\ninline ::std::string* release_$name$()$deprecation$;\ninline void set_allocated_$name$(::std::string* $name$)$deprecation$;\n"
                    );
  pFVar2 = FieldDescriptor::options(this->descriptor_);
  FVar1 = FieldOptions::ctype(pFVar2);
  if (FVar1 != FieldOptions_CType_STRING) {
    io::Printer::Outdent(printer);
    io::Printer::Print(printer," public:\n");
    io::Printer::Indent(printer);
  }
  return;
}

Assistant:

void StringFieldGenerator::
GenerateAccessorDeclarations(io::Printer* printer) const {
  // If we're using StringFieldGenerator for a field with a ctype, it's
  // because that ctype isn't actually implemented.  In particular, this is
  // true of ctype=CORD and ctype=STRING_PIECE in the open source release.
  // We aren't releasing Cord because it has too many Google-specific
  // dependencies and we aren't releasing StringPiece because it's hardly
  // useful outside of Google and because it would get confusing to have
  // multiple instances of the StringPiece class in different libraries (PCRE
  // already includes it for their C++ bindings, which came from Google).
  //
  // In any case, we make all the accessors private while still actually
  // using a string to represent the field internally.  This way, we can
  // guarantee that if we do ever implement the ctype, it won't break any
  // existing users who might be -- for whatever reason -- already using .proto
  // files that applied the ctype.  The field can still be accessed via the
  // reflection interface since the reflection interface is independent of
  // the string's underlying representation.
  if (descriptor_->options().ctype() != FieldOptions::STRING) {
    printer->Outdent();
    printer->Print(
      " private:\n"
      "  // Hidden due to unknown ctype option.\n");
    printer->Indent();
  }

  printer->Print(variables_,
    "inline const ::std::string& $name$() const$deprecation$;\n"
    "inline void set_$name$(const ::std::string& value)$deprecation$;\n"
    "inline void set_$name$(const char* value)$deprecation$;\n"
    "inline void set_$name$(const $pointer_type$* value, size_t size)"
                 "$deprecation$;\n"
    "inline ::std::string* mutable_$name$()$deprecation$;\n"
    "inline ::std::string* release_$name$()$deprecation$;\n"
    "inline void set_allocated_$name$(::std::string* $name$)$deprecation$;\n");


  if (descriptor_->options().ctype() != FieldOptions::STRING) {
    printer->Outdent();
    printer->Print(" public:\n");
    printer->Indent();
  }
}